

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_prune(tlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
           *this,time_point now)

{
  _Base_ptr p_Var1;
  _List_node_base *p_Var2;
  
  if (this->m_used_size != 0) {
    p_Var1 = (this->m_ttl_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var2 = (this->m_lru_list).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl._M_node.super__List_node_base._M_prev + 1;
    if (*(long *)(p_Var1 + 1) <= (long)now.__d.__r) {
      p_Var2 = (_List_node_base *)&p_Var1[1]._M_parent;
    }
    do_erase(this,(size_t)p_Var2->_M_next);
    return;
  }
  return;
}

Assistant:

auto do_prune(std::chrono::steady_clock::time_point now) -> void
    {
        if (m_used_size > 0)
        {
            auto& [expire_time, element_idx] = *m_ttl_list.begin();

            if (now >= expire_time)
            {
                // If there is an expired item, prefer to remove that.
                do_erase(element_idx);
            }
            else
            {
                // Otherwise pick the least recently used item to prune.
                size_t lru_idx = m_lru_list.back();
                do_erase(lru_idx);
            }
        }
    }